

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::NegativeLinkErrors::Run(NegativeLinkErrors *this)

{
  bool bVar1;
  long lStack_60;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  bVar1 = ShaderImageLoadStoreBase::SupportedInVS(&this->super_ShaderImageLoadStoreBase,1);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "#version 420 core\nlayout(location = 0) in vec4 i_position;\nlayout(rgba32f) uniform image1D g_image;\nvoid main() {\n  imageStore(g_image, gl_VertexID, vec4(0));\n  gl_Position = i_position;\n}"
               ,&local_51);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(rgba32f) uniform image2D g_image;\nvoid main() {\n  imageStore(g_image, ivec2(gl_FragCoord), vec4(1.0));\n  o_color = vec4(1.0);\n}"
               ,&local_52);
    bVar1 = Link(this,&local_30,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,
                 "#version 420 core\nlayout(location = 0) in vec4 i_position;\nlayout(rgba32f) uniform image1D g_image;\nvoid main() {\n  imageStore(g_image, gl_VertexID, vec4(0));\n  gl_Position = i_position;\n}"
                 ,&local_51);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(rg32f) uniform image1D g_image;\nvoid main() {\n  imageStore(g_image, int(gl_FragCoord.x), vec4(1.0));\n  o_color = vec4(1.0);\n}"
                 ,&local_52);
      bVar1 = Link(this,&local_30,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      lStack_60 = (ulong)bVar1 - 1;
    }
    else {
      lStack_60 = -1;
    }
  }
  else {
    lStack_60 = 0x10;
  }
  return lStack_60;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		if (!Link("#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
				  "layout(rgba32f) uniform image1D g_image;" NL "void main() {" NL
				  "  imageStore(g_image, gl_VertexID, vec4(0));" NL "  gl_Position = i_position;" NL "}",
				  "#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
				  "layout(rgba32f) uniform image2D g_image;" NL "void main() {" NL
				  "  imageStore(g_image, ivec2(gl_FragCoord), vec4(1.0));" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Link("#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
				  "layout(rgba32f) uniform image1D g_image;" NL "void main() {" NL
				  "  imageStore(g_image, gl_VertexID, vec4(0));" NL "  gl_Position = i_position;" NL "}",
				  "#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
				  "layout(rg32f) uniform image1D g_image;" NL "void main() {" NL
				  "  imageStore(g_image, int(gl_FragCoord.x), vec4(1.0));" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		return NO_ERROR;
	}